

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O0

void __thiscall
SaltedOutpointHasher::SaltedOutpointHasher(SaltedOutpointHasher *this,bool deterministic)

{
  long lVar1;
  byte in_SIL;
  uint64_t *in_RDI;
  long in_FS_OFFSET;
  FastRandomContext *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 fDeterministic;
  FastRandomContext *this_00;
  FastRandomContext *in_stack_fffffffffffffeb8;
  FastRandomContext *this_01;
  FastRandomContext *in_stack_fffffffffffffec0;
  FastRandomContext *local_138;
  
  fDeterministic = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_SIL & 1) == 0) {
    FastRandomContext::FastRandomContext(in_stack_fffffffffffffeb8,(bool)fDeterministic);
    local_138 = (FastRandomContext *)FastRandomContext::rand64(in_stack_fffffffffffffec0);
    FastRandomContext::~FastRandomContext(in_stack_fffffffffffffea8);
  }
  else {
    local_138 = (FastRandomContext *)0x8e819f2607a18de6;
  }
  *in_RDI = (uint64_t)local_138;
  this_01 = (FastRandomContext *)(in_RDI + 1);
  if ((in_SIL & 1) == 0) {
    FastRandomContext::FastRandomContext(this_01,(bool)fDeterministic);
    this_00 = (FastRandomContext *)FastRandomContext::rand64(local_138);
    FastRandomContext::~FastRandomContext(this_00);
  }
  else {
    this_00 = (FastRandomContext *)0xf4020d2e3983b0eb;
  }
  (this_01->super_RandomMixin<FastRandomContext>).bitbuf = (uint64_t)this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SaltedOutpointHasher::SaltedOutpointHasher(bool deterministic) :
    k0{deterministic ? 0x8e819f2607a18de6 : FastRandomContext().rand64()},
    k1{deterministic ? 0xf4020d2e3983b0eb : FastRandomContext().rand64()}
{}